

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * __thiscall
doctest::detail::stringifyBinaryExpr<std::tuple<char_const&,char_const&>,std::tuple<char,char>>
          (String *__return_storage_ptr__,detail *this,tuple<const_char_&,_const_char_&> *lhs,
          char *op,tuple<char,_char> *rhs)

{
  tuple<char,_char> *in;
  String SStack_78;
  String local_60;
  String local_48;
  String local_30;
  
  toStream<std::tuple<char_const&,char_const&>>(&local_48,this,lhs);
  String::String(&local_60,(char *)lhs);
  doctest::operator+(&local_30,&local_48,&local_60);
  toStream<std::tuple<char,char>>(&SStack_78,(detail *)op,in);
  doctest::operator+(__return_storage_ptr__,&local_30,&SStack_78);
  String::~String(&SStack_78);
  String::~String(&local_30);
  String::~String(&local_60);
  String::~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }